

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::Lookup(PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
         *this,interval_t *value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  primitive_dictionary_entry_t *ppVar6;
  long lVar7;
  long lVar8;
  
  uVar5 = duckdb::Hash<duckdb::interval_t>(*value);
  uVar5 = uVar5 & this->capacity_mask;
  ppVar6 = this->dictionary + uVar5;
  if (ppVar6->index != 0xffffffff) {
    lVar3 = value->micros;
    lVar7 = lVar3 / 86400000000 + (long)value->days;
    do {
      iVar1 = (ppVar6->value).months;
      iVar2 = (ppVar6->value).days;
      lVar4 = (ppVar6->value).micros;
      if ((iVar2 == value->days && iVar1 == value->months) && lVar4 == lVar3) {
        return ppVar6;
      }
      lVar8 = (long)iVar2 + lVar4 / 86400000000;
      if ((((long)iVar1 + lVar8 / 0x1e == lVar7 / 0x1e + (long)value->months) &&
          (lVar8 % 0x1e == lVar7 % 0x1e)) && (lVar4 % 86400000000 == lVar3 % 86400000000)) {
        return ppVar6;
      }
      uVar5 = uVar5 + 1 & this->capacity_mask;
      ppVar6 = this->dictionary + uVar5;
    } while (ppVar6->index != 0xffffffff);
  }
  return ppVar6;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}